

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

void __thiscall
protozero::Message::AppendVarInt<unsigned_long>(Message *this,uint32_t field_id,unsigned_long value)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t buffer [15];
  byte local_27 [15];
  
  if (this->nested_message_ != (Message *)0x0) {
    EndNestedMessage(this);
  }
  uVar3 = field_id << 3;
  pbVar2 = local_27;
  uVar4 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      pbVar2 = pbVar2 + 1;
      uVar3 = uVar4 >> 7;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  pbVar2 = pbVar2 + 1;
  uVar5 = value;
  if (0x7f < value) {
    do {
      *pbVar2 = (byte)uVar5 | 0x80;
      pbVar2 = pbVar2 + 1;
      value = uVar5 >> 7;
      bVar1 = 0x3fff < uVar5;
      uVar5 = value;
    } while (bVar1);
  }
  *pbVar2 = (byte)value;
  WriteToStream(this,local_27,pbVar2 + 1);
  return;
}

Assistant:

void AppendVarInt(uint32_t field_id, T value) {
    if (nested_message_)
      EndNestedMessage();

    uint8_t buffer[proto_utils::kMaxSimpleFieldEncodedSize];
    uint8_t* pos = buffer;

    pos = proto_utils::WriteVarInt(proto_utils::MakeTagVarInt(field_id), pos);
    // WriteVarInt encodes signed values in two's complement form.
    pos = proto_utils::WriteVarInt(value, pos);
    WriteToStream(buffer, pos);
  }